

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHolder.cpp
# Opt level: O1

ssize_t __thiscall Storage::FileHolder::read(FileHolder *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t __new_size;
  undefined4 in_register_00000034;
  allocator_type local_19;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(size_type)__buf,
             &local_19);
  __new_size = fread(this->file_,1,(size_t)__buf,*(FILE **)CONCAT44(in_register_00000034,__fd));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,__new_size);
  return (ssize_t)this;
}

Assistant:

std::vector<uint8_t> FileHolder::read(std::size_t size) {
	std::vector<uint8_t> result(size);
	result.resize(std::fread(result.data(), 1, size, file_));
	return result;
}